

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::IOBlock::glslTraverseBasicTypeArray
          (string *__return_storage_ptr__,IOBlock *this,int numArrayElements,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  int local_190;
  undefined1 local_189;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  int local_104;
  undefined1 local_100 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string indentation;
  BasicTypeVisitFunc visit_local;
  int indentationDepth_local;
  int numArrayElements_local;
  IOBlock *this_local;
  string *result;
  
  indentation.field_2._8_8_ = visit;
  visit_local._0_4_ = indentationDepth;
  visit_local._4_4_ = numArrayElements;
  _indentationDepth_local = this;
  this_local = (IOBlock *)__return_storage_ptr__;
  if (numArrayElements < 0) {
    local_189 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    for (local_190 = 0; iVar1 = local_190,
        sVar2 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                ::size(&this->m_members), iVar1 < (int)sVar2; local_190 = local_190 + 1) {
      std::operator+(&local_1f0,&this->m_interfaceName,"[gl_InvocationID].");
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
               ::operator[](&this->m_members,(long)local_190);
      std::operator+(&local_1d0,&local_1f0,&pvVar3->name);
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
               ::operator[](&this->m_members,(long)local_190);
      glslTraverseBasicTypes
                (&local_1b0,&local_1d0,&pvVar3->type,0,(int)visit_local,
                 (BasicTypeVisitFunc)indentation.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,(long)indentationDepth,'\t',&local_49);
    std::allocator<char>::~allocator(&local_49);
    local_5d = 0;
    std::operator+(&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   "for (int i0 = 0; i0 < ");
    de::toString<int>((string *)local_100,(int *)((long)&visit_local + 4));
    std::operator+(&local_c0,&local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    std::operator+(&local_a0,&local_c0,"; i0++)\n");
    std::operator+(&local_80,&local_a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::operator+(__return_storage_ptr__,&local_80,"{\n");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    for (local_104 = 0; iVar1 = local_104,
        sVar2 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
                ::size(&this->m_members), iVar1 < (int)sVar2; local_104 = local_104 + 1) {
      std::operator+(&local_168,&this->m_interfaceName,"[i0].");
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
               ::operator[](&this->m_members,(long)local_104);
      std::operator+(&local_148,&local_168,&pvVar3->name);
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UserDefinedIOCase::IOBlock::Member>_>
               ::operator[](&this->m_members,(long)local_104);
      glslTraverseBasicTypes
                (&local_128,&local_148,&pvVar3->type,1,(int)visit_local + 1,
                 (BasicTypeVisitFunc)indentation.field_2._8_8_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   "}\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&i_1);
    std::__cxx11::string::~string((string *)&i_1);
    local_5d = 1;
    std::__cxx11::string::~string((string *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::IOBlock::glslTraverseBasicTypeArray (int numArrayElements, int indentationDepth, BasicTypeVisitFunc visit) const
{
	if (numArrayElements >= 0)
	{
		const string	indentation			= string(indentationDepth, '\t');
		string			result				= indentation + "for (int i0 = 0; i0 < " + de::toString(numArrayElements) + "; i0++)\n" +
											  indentation + "{\n";
		for (int i = 0; i < (int)m_members.size(); i++)
			result += UserDefinedIOCase::glslTraverseBasicTypes(m_interfaceName + "[i0]." + m_members[i].name, m_members[i].type, 1, indentationDepth+1, visit);
		result += indentation + "}\n";
		return result;
	}
	else
	{
		string result;
		for (int i = 0; i < (int)m_members.size(); i++)
			result += UserDefinedIOCase::glslTraverseBasicTypes(m_interfaceName + "[gl_InvocationID]." + m_members[i].name, m_members[i].type, 0, indentationDepth, visit);
		return result;
	}
}